

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwUpdateGamepadMappings(char *string)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  _GLFWmapping *p_Var9;
  char cVar10;
  char *pcVar11;
  long lVar12;
  byte bVar13;
  _GLFWmapping mapping;
  char line [1024];
  char *local_6a8;
  undefined8 uStack_6a0;
  char *local_698 [45];
  byte local_52d [128];
  undefined8 local_4ad;
  undefined8 uStack_4a5;
  undefined8 local_49d;
  undefined8 uStack_495;
  undefined1 local_48c [4];
  undefined1 local_488 [4];
  undefined1 local_484 [4];
  undefined1 local_480 [4];
  undefined1 local_47c [4];
  undefined1 local_478 [4];
  undefined1 local_474 [4];
  undefined1 local_470 [4];
  undefined1 local_46c [4];
  undefined1 local_468 [4];
  undefined1 local_464 [4];
  undefined1 local_460 [4];
  undefined1 local_45c [4];
  undefined1 local_458 [4];
  undefined1 local_454 [4];
  undefined1 local_450 [4];
  undefined1 local_44c [4];
  undefined1 local_448 [4];
  undefined1 local_444 [4];
  undefined1 local_440 [4];
  undefined1 local_43c [4];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  char local_418;
  char local_417 [999];
  
  if (string == (char *)0x0) {
    __assert_fail("string != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/glfw/src/input.c"
                  ,0x48a,"int glfwUpdateGamepadMappings(const char *)");
  }
  if (_glfw.initialized == 0) {
    iVar4 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    bVar13 = *string;
    while (bVar13 != 0) {
      if (((byte)(bVar13 - 0x30) < 10) ||
         ((bVar13 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar13 - 0x41) & 0x3f) & 1) != 0))))
      {
        sVar5 = strcspn(string,"\r\n");
        if (sVar5 < 0x400) {
          memset(local_52d,0,0xf5);
          memcpy(&local_438,string,sVar5);
          *(undefined1 *)((long)&local_438 + sVar5) = 0;
          local_698[0] = "platform";
          local_698[1] = (char *)0x0;
          local_698[2] = "a";
          local_698[3] = local_48c;
          local_698[4] = "b";
          local_698[5] = local_488;
          local_698[6] = "x";
          local_698[7] = local_484;
          local_698[8] = "y";
          local_698[9] = local_480;
          local_698[10] = "back";
          local_698[0xb] = local_474;
          local_698[0xc] = "start";
          local_698[0xd] = local_470;
          local_698[0xe] = "guide";
          local_698[0xf] = local_46c;
          local_698[0x10] = "leftshoulder";
          local_698[0x11] = local_47c;
          local_698[0x12] = "rightshoulder";
          local_698[0x13] = local_478;
          local_698[0x14] = "leftstick";
          local_698[0x15] = local_468;
          local_698[0x16] = "rightstick";
          local_698[0x17] = local_464;
          local_698[0x18] = "dpup";
          local_698[0x19] = local_460;
          local_698[0x1a] = "dpright";
          local_698[0x1b] = local_45c;
          local_698[0x1c] = "dpdown";
          local_698[0x1d] = local_458;
          local_698[0x1e] = "dpleft";
          local_698[0x1f] = local_454;
          local_698[0x20] = "lefttrigger";
          local_698[0x21] = local_440;
          local_698[0x22] = "righttrigger";
          local_698[0x23] = local_43c;
          local_698[0x24] = "leftx";
          local_698[0x25] = local_450;
          local_698[0x26] = "lefty";
          local_698[0x27] = local_44c;
          local_698[0x28] = "rightx";
          local_698[0x29] = local_448;
          local_698[0x2a] = "righty";
          local_698[0x2b] = local_444;
          local_6a8 = (char *)&local_438;
          sVar6 = strcspn((char *)&local_438,",");
          if ((sVar6 == 0x20) && (local_418 == ',')) {
            local_49d = local_428;
            uStack_495 = uStack_420;
            local_4ad = local_438;
            uStack_4a5 = uStack_430;
            local_6a8 = local_417;
            sVar6 = strcspn(local_6a8,",");
            if ((sVar6 < 0x80) && (local_417[sVar6] == ',')) {
              memcpy(local_52d,local_417,sVar6);
              pcVar11 = local_417 + sVar6 + 1;
LAB_00150639:
              cVar3 = *pcVar11;
              local_6a8 = pcVar11;
              if ((cVar3 != '-') && (cVar3 != '+')) {
                if (cVar3 != '\0') goto code_r0x0015065b;
                lVar12 = 0x80;
                do {
                  if ((byte)(local_52d[lVar12] + 0xbf) < 6) {
                    local_52d[lVar12] = local_52d[lVar12] | 0x20;
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 0xa0);
                _glfwPlatformUpdateGamepadGUID((char *)&local_4ad);
                p_Var9 = findMapping((char *)&local_4ad);
                if (p_Var9 == (_GLFWmapping *)0x0) {
                  lVar12 = (long)_glfw.mappingCount;
                  _glfw.mappingCount = (int)(lVar12 + 1);
                  _glfw.mappings = (_GLFWmapping *)realloc(_glfw.mappings,(lVar12 + 1) * 0xf5);
                  p_Var9 = _glfw.mappings + (long)_glfw.mappingCount + -1;
                }
                memcpy(p_Var9,local_52d,0xf5);
              }
              goto LAB_0015080d;
            }
          }
          _glfwInputError(0x10004,(char *)0x0);
        }
LAB_0015080d:
        string = (char *)((byte *)string + sVar5);
      }
      else {
        sVar5 = strcspn(string,"\r\n");
        sVar6 = strspn((char *)((byte *)string + sVar5),"\r\n");
        string = (char *)((byte *)string + sVar5 + sVar6);
      }
      bVar13 = *string;
    }
    lVar12 = 0;
    do {
      if (*(int *)(_glfw.joysticks[0].guid + lVar12 + -0x48) != 0) {
        p_Var9 = findValidMapping((_GLFWjoystick *)(_glfw.joysticks[0].guid + lVar12 + -0x48));
        *(_GLFWmapping **)(_glfw.joysticks[0].linjs.path + lVar12 + -0xc) = p_Var9;
      }
      lVar12 = lVar12 + 0x1fa0;
    } while (lVar12 != 0x1fa00);
    iVar4 = 1;
  }
  return iVar4;
code_r0x0015065b:
  lVar12 = 8;
  do {
    pcVar1 = *(char **)((long)&uStack_6a0 + lVar12);
    sVar6 = strlen(pcVar1);
    iVar4 = strncmp(pcVar11,pcVar1,sVar6);
    if ((iVar4 == 0) && (pcVar11[sVar6] == ':')) {
      local_6a8 = pcVar11 + sVar6 + 1;
      pcVar1 = *(char **)((long)local_698 + lVar12);
      if (pcVar1 == (char *)0x0) {
        iVar4 = strncmp(local_6a8,"Linux",5);
        if (iVar4 != 0) goto LAB_0015080d;
        break;
      }
      if (*local_6a8 == '-') {
        uStack_6a0._4_4_ = -1;
        local_6a8 = pcVar11 + sVar6 + 2;
        iVar4 = 0;
      }
      else {
        iVar4 = 1;
        if (*local_6a8 == '+') {
          local_6a8 = pcVar11 + sVar6 + 2;
          uStack_6a0._4_4_ = 0;
        }
        else {
          uStack_6a0._4_4_ = -1;
        }
      }
      cVar3 = *local_6a8;
      if (cVar3 == 'a') {
        bVar2 = false;
        cVar3 = '\x01';
      }
      else if (cVar3 == 'h') {
        cVar3 = '\x03';
        bVar2 = true;
      }
      else {
        if (cVar3 != 'b') break;
        cVar3 = '\x02';
        bVar2 = false;
      }
      *pcVar1 = cVar3;
      uVar7 = strtoul(local_6a8 + 1,&local_6a8,10);
      bVar13 = (byte)uVar7;
      if (bVar2) {
        uVar8 = strtoul(local_6a8 + 1,&local_6a8,10);
        bVar13 = (byte)(uVar7 << 4) | (byte)uVar8;
      }
      pcVar1[1] = bVar13;
      if (*pcVar1 == '\x01') {
        cVar3 = (char)(2 / (ulong)(uint)(iVar4 - uStack_6a0._4_4_));
        pcVar1[2] = cVar3;
        cVar10 = (char)iVar4 + (char)uStack_6a0._4_4_;
        pcVar1[3] = -cVar10;
        if (*local_6a8 == '~') {
          pcVar1[2] = -cVar3;
          pcVar1[3] = cVar10;
        }
      }
      break;
    }
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x168);
  pcVar11 = local_6a8;
  sVar6 = strcspn(local_6a8,",");
  pcVar11 = pcVar11 + sVar6;
  local_6a8 = pcVar11;
  sVar6 = strspn(pcVar11,",");
  pcVar11 = pcVar11 + sVar6;
  goto LAB_00150639;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if ((*c >= '0' && *c <= '9') ||
            (*c >= 'a' && *c <= 'f') ||
            (*c >= 'A' && *c <= 'F'))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}